

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O3

tokens __thiscall JSON::JSONScanner::ScanString(JSONScanner *this)

{
  Type *pTVar1;
  uint *puVar2;
  char16 cVar3;
  int iVar4;
  Type pRVar5;
  code *pcVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  RangeCharacterPairList *pRVar12;
  char16 *pcVar13;
  uint uVar14;
  ulong uVar15;
  char16 *pcVar16;
  ulong uVar17;
  char16 *pcVar18;
  char16 *pcVar19;
  uint uVar20;
  char16 *pcVar21;
  int local_34 [2];
  int tempHex;
  
  this->currentIndex = 0;
  pcVar16 = this->currentChar;
  this->currentString = pcVar16;
  pcVar21 = this->inputText;
  uVar17 = (ulong)this->inputLen;
  pcVar19 = pcVar21 + uVar17;
  if (pcVar16 < pcVar19) {
    bVar9 = true;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar15 = 0;
    pcVar18 = pcVar16;
    do {
      pcVar13 = pcVar18 + 1;
      this->currentChar = pcVar13;
      cVar3 = *pcVar18;
      uVar14 = (uint)uVar15;
      if (cVar3 == L'\"') {
        if (bVar9) {
          this->currentIndex = uVar14;
          Output::TraceWithFlush
                    (JSONPhase,L"ScanString(): direct-mapped string as \'%.*s\'\n",uVar15,
                     this->currentString);
        }
        else {
          if (uVar14 != 0) {
            pRVar12 = GetCurrentRangeCharacterPairList(this);
            pcVar19 = this->inputText;
            JsUtil::
            List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pRVar12,0);
            pRVar5 = (pRVar12->
                     super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                     ).buffer;
            iVar4 = (pRVar12->
                    super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            pRVar5[iVar4].m_rangeStart = (uint)((ulong)((long)pcVar16 - (long)pcVar19) >> 1);
            pRVar5[iVar4].m_rangeLength = uVar14;
            pRVar5[iVar4].m_char = L'\0';
            pTVar1 = &(pRVar12->
                      super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count;
            *pTVar1 = *pTVar1 + 1;
            puVar2 = &this->currentIndex;
            uVar20 = *puVar2;
            *puVar2 = *puVar2 + uVar14;
            if (CARRY4(uVar20,uVar14)) goto LAB_00b635fb;
          }
          BuildUnescapedString(this,uVar14 != 0);
          pRVar12 = GetCurrentRangeCharacterPairList(this);
          (pRVar12->
          super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
          ).count = 0;
          this->currentString = this->stringBuffer;
        }
        this->pToken->tk = tkStrCon;
        return tkStrCon;
      }
      if ((ushort)cVar3 < 0x20) goto switchD_00b63352_caseD_6f;
      if (cVar3 == L'\\') {
        if (pcVar19 <= pcVar13) break;
        this->currentChar = pcVar18 + 2;
        cVar3 = pcVar18[1];
        uVar20 = (uint)(ushort)cVar3;
        if ((ushort)cVar3 < 0x62) {
          if ((ushort)cVar3 < 0x2f) {
            if (cVar3 != L'\"') {
              if (cVar3 != L'\0') goto switchD_00b63352_caseD_6f;
              this->currentChar = pcVar13;
              break;
            }
          }
          else if ((cVar3 != L'/') && (cVar3 != L'\\')) {
switchD_00b63352_caseD_6f:
            ThrowSyntaxError(this,-0x7ff5e9e9);
          }
        }
        else {
          switch(cVar3) {
          case L'n':
            uVar20 = 10;
            break;
          case L'o':
          case L'p':
          case L'q':
          case L's':
            goto switchD_00b63352_caseD_6f;
          case L'r':
            uVar20 = 0xd;
            break;
          case L't':
            uVar20 = 9;
            break;
          case L'u':
            if (pcVar19 <= pcVar18 + 5) goto LAB_00b63537;
            this->currentChar = pcVar18 + 3;
            BVar10 = Js::NumberUtilities::FHexDigit(pcVar18[2],local_34);
            iVar4 = local_34[0];
            if (BVar10 == 0) {
LAB_00b63600:
              ThrowSyntaxError(this,-0x7ff5e9e8);
            }
            pcVar19 = this->currentChar;
            this->currentChar = pcVar19 + 1;
            BVar10 = Js::NumberUtilities::FHexDigit(*pcVar19,local_34);
            iVar7 = local_34[0];
            if (BVar10 == 0) goto LAB_00b63600;
            pcVar19 = this->currentChar;
            this->currentChar = pcVar19 + 1;
            BVar10 = Js::NumberUtilities::FHexDigit(*pcVar19,local_34);
            iVar8 = local_34[0];
            if (BVar10 == 0) goto LAB_00b63600;
            pcVar19 = this->currentChar;
            this->currentChar = pcVar19 + 1;
            BVar10 = Js::NumberUtilities::FHexDigit(*pcVar19,local_34);
            if (BVar10 == 0) goto LAB_00b63600;
            uVar20 = iVar8 * 0x10 + iVar7 * 0x100 + iVar4 * 0x1000 + local_34[0];
            if (0xffff < uVar20) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar11 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                                 ,0x14a,"(chcode == (chcode & 0xFFFF))","Bad unicode code");
              if (!bVar9) {
                pcVar6 = (code *)invalidInstructionException();
                (*pcVar6)();
              }
              *puVar11 = 0;
            }
            break;
          default:
            if (cVar3 == L'b') {
              uVar20 = 8;
            }
            else {
              if (cVar3 != L'f') goto switchD_00b63352_caseD_6f;
              uVar20 = 0xc;
            }
          }
        }
        pRVar12 = GetCurrentRangeCharacterPairList(this);
        pcVar19 = this->inputText;
        JsUtil::
        List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pRVar12,0);
        pRVar5 = (pRVar12->
                 super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                 ).buffer;
        iVar4 = (pRVar12->
                super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        pRVar5[iVar4].m_rangeStart = (uint)((ulong)((long)pcVar16 - (long)pcVar19) >> 1);
        pRVar5[iVar4].m_rangeLength = uVar14;
        pRVar5[iVar4].m_char = (char16)uVar20;
        pTVar1 = &(pRVar12->
                  super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
        *pTVar1 = *pTVar1 + 1;
        puVar2 = &this->currentIndex;
        uVar20 = *puVar2;
        *puVar2 = *puVar2 + uVar14 + 1;
        if (CARRY4(uVar20,uVar14 + 1)) {
LAB_00b635fb:
          Js::Throw::OutOfMemory();
        }
        pcVar13 = this->currentChar;
        pcVar21 = this->inputText;
        uVar17 = (ulong)this->inputLen;
        bVar9 = false;
        uVar15 = 0;
        pcVar16 = pcVar13;
      }
      else {
        uVar15 = (ulong)(uVar14 + 1);
      }
      pcVar19 = pcVar21 + uVar17;
      pcVar18 = pcVar13;
    } while (pcVar13 < pcVar19);
  }
LAB_00b63537:
  ThrowSyntaxError(this,-0x7ff5e9e7);
}

Assistant:

tokens JSONScanner::ScanString()
    {
        char16 ch;

        this->currentIndex = 0;
        this->currentString = const_cast<char16*>(currentChar);
        bool endFound = false;
        bool isStringDirectInputTextMapped = true;
        LPCWSTR bulkStart = currentChar;
        uint bulkLength = 0;

        while (currentChar < inputText + inputLen)
        {
            ch = ReadNextChar();
            int tempHex;

            if (ch == '"')
            {
                //end of the string
                endFound = true;
                break;
            }
            else if (ch <= 0x1F)
            {
                //JSON doesn't accept \u0000 - \u001f range, LS(\u2028) and PS(\u2029) are ok
               ThrowSyntaxError(JSERR_JsonIllegalChar);
            }
            else if ( 0 == ch )
            {
                currentChar--;
               ThrowSyntaxError(JSERR_JsonNoStrEnd);
            }
            else if ('\\' == ch)
            {
                //JSON escape sequence in a string \", \/, \\, \b, \f, \n, \r, \t, unicode seq
                // unlikely V5.8 regular chars are not escaped, i.e '\g'' in a string is illegal not 'g'
                if (currentChar >= inputText + inputLen )
                {
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);
                }

                ch = ReadNextChar();
                switch (ch)
                {
                case 0:
                    currentChar--;
                   ThrowSyntaxError(JSERR_JsonNoStrEnd);

                case '"':
                case '/':
                case '\\':
                    //keep ch
                    break;

                case 'b':
                    ch = 0x08;
                    break;

                case 'f':
                    ch = 0x0C;
                    break;

                case 'n':
                    ch = 0x0A;
                    break;

                case 'r':
                    ch = 0x0D;
                    break;

                case 't':
                    ch = 0x09;
                    break;

                case 'u':
                    {
                        int chcode;
                        // 4 hex digits
                        if (currentChar + 3 >= inputText + inputLen)
                        {
                            //no room left for 4 hex chars
                           ThrowSyntaxError(JSERR_JsonNoStrEnd);

                        }
                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode = tempHex * 0x1000;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0100;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex * 0x0010;

                        if (!Js::NumberUtilities::FHexDigit((WCHAR)ReadNextChar(), &tempHex))
                        {
                           ThrowSyntaxError(JSERR_JsonBadHexDigit);
                        }
                        chcode += tempHex;
                        AssertMsg(chcode == (chcode & 0xFFFF), "Bad unicode code");
                        ch = (char16)chcode;
                    }
                    break;

                default:
                    // Any other '\o' is an error in JSON
                   ThrowSyntaxError(JSERR_JsonIllegalChar);
                }

                // flush
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, ch));

                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                currentIndex++;

                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }

                // mark the mode as 'string transformed' (no direct mapping in inputText possible)
                isStringDirectInputTextMapped = false;

                // reset (to next char)
                bulkStart = currentChar;
                bulkLength = 0;
            }
            else
            {
                // continue
                bulkLength++;
            }
        }

        if (!endFound)
        {
            // no ending '"' found
           ThrowSyntaxError(JSERR_JsonNoStrEnd);
        }

        if (isStringDirectInputTextMapped == false)
        {
            // If the last bulk is not ended with an escape character, make sure that is
            // not built into the final unescaped string
            bool shouldSkipLastCharacter = false;
            if (bulkLength > 0)
            {
                shouldSkipLastCharacter = true;
                this->GetCurrentRangeCharacterPairList()->Add(RangeCharacterPair((uint)(bulkStart - inputText), bulkLength, _u('\0')));
                uint oldIndex = currentIndex;
                currentIndex += bulkLength;
                if (currentIndex < oldIndex)
                {
                    // Overflow
                    Js::Throw::OutOfMemory();
                }
            }

            this->BuildUnescapedString(shouldSkipLastCharacter);
            this->GetCurrentRangeCharacterPairList()->Clear();
            this->currentString = this->stringBuffer;
        }
        else
        {
            // make currentIndex the length (w/o the \0)
            currentIndex = bulkLength;

            OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("ScanString(): direct-mapped string as '%.*s'\n"),
                GetCurrentStringLen(), GetCurrentString());
        }

        return (pToken->tk = tkStrCon);
    }